

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O0

void key_iterator_suite::iterate_array(void)

{
  bool bVar1;
  type tVar2;
  const_reference pbVar3;
  size_type in_RCX;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_500;
  key_iterator local_4f8;
  int local_4a0 [2];
  key_iterator local_498;
  int local_440 [2];
  key_iterator local_438;
  int local_3e0 [2];
  key_iterator local_3d8;
  int local_380 [2];
  key_iterator local_378;
  double local_328;
  int local_320 [2];
  key_iterator local_318;
  int local_2c4 [3];
  key_iterator local_2b8;
  bool local_261;
  int local_260 [2];
  key_iterator local_258;
  undefined1 local_208 [8];
  key_iterator where;
  basic_variable<std::allocator<char>_> local_198;
  basic_variable<std::allocator<char>_> local_168;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_198,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_168,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_138,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_108,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a8,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_78,L"delta");
  local_48._0_8_ = &local_198;
  local_48._8_8_ = 7;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x7;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_500 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_500 = local_500 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_500);
  } while (local_500 != &local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_begin
            ((key_iterator *)local_208,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end
            (&local_258,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator!=
                    ((key_iterator *)local_208,&local_258);
  boost::detail::test_impl
            ("where != data.key_end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc46,"void key_iterator_suite::iterate_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_258);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator*
                     ((key_iterator *)local_208);
  local_260[1] = 0;
  tVar2 = trial::dynamic::operator==(pbVar3,local_260 + 1);
  boost::detail::test_impl
            ("*where == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc47,"void key_iterator_suite::iterate_array()",tVar2);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::key
                     ((key_iterator *)local_208);
  local_260[0] = 0;
  tVar2 = trial::dynamic::operator==(pbVar3,local_260);
  boost::detail::test_impl
            ("where.key() == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc48,"void key_iterator_suite::iterate_array()",tVar2);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::value
                     ((key_iterator *)local_208);
  local_261 = true;
  tVar2 = trial::dynamic::operator==(pbVar3,&local_261);
  boost::detail::test_impl
            ("where.value() == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc49,"void key_iterator_suite::iterate_array()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator++
            ((key_iterator *)local_208);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end
            (&local_2b8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator!=
                    ((key_iterator *)local_208,&local_2b8);
  boost::detail::test_impl
            ("where != data.key_end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc4b,"void key_iterator_suite::iterate_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_2b8);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator*
                     ((key_iterator *)local_208);
  local_2c4[2] = 1;
  tVar2 = trial::dynamic::operator==(pbVar3,local_2c4 + 2);
  boost::detail::test_impl
            ("*where == 1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc4c,"void key_iterator_suite::iterate_array()",tVar2);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::key
                     ((key_iterator *)local_208);
  local_2c4[1] = 1;
  tVar2 = trial::dynamic::operator==(pbVar3,local_2c4 + 1);
  boost::detail::test_impl
            ("where.key() == 1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc4d,"void key_iterator_suite::iterate_array()",tVar2);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::value
                     ((key_iterator *)local_208);
  local_2c4[0] = 2;
  tVar2 = trial::dynamic::operator==(pbVar3,local_2c4);
  boost::detail::test_impl
            ("where.value() == 2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc4e,"void key_iterator_suite::iterate_array()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator++
            ((key_iterator *)local_208);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end
            (&local_318,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator!=
                    ((key_iterator *)local_208,&local_318);
  boost::detail::test_impl
            ("where != data.key_end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc50,"void key_iterator_suite::iterate_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_318);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator*
                     ((key_iterator *)local_208);
  local_320[1] = 2;
  tVar2 = trial::dynamic::operator==(pbVar3,local_320 + 1);
  boost::detail::test_impl
            ("*where == 2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc51,"void key_iterator_suite::iterate_array()",tVar2);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::key
                     ((key_iterator *)local_208);
  local_320[0] = 2;
  tVar2 = trial::dynamic::operator==(pbVar3,local_320);
  boost::detail::test_impl
            ("where.key() == 2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc52,"void key_iterator_suite::iterate_array()",tVar2);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::value
                     ((key_iterator *)local_208);
  local_328 = 3.0;
  tVar2 = trial::dynamic::operator==(pbVar3,&local_328);
  boost::detail::test_impl
            ("where.value() == 3.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc53,"void key_iterator_suite::iterate_array()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator++
            ((key_iterator *)local_208);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end
            (&local_378,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator!=
                    ((key_iterator *)local_208,&local_378);
  boost::detail::test_impl
            ("where != data.key_end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc55,"void key_iterator_suite::iterate_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_378);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator*
                     ((key_iterator *)local_208);
  local_380[1] = 3;
  tVar2 = trial::dynamic::operator==(pbVar3,local_380 + 1);
  boost::detail::test_impl
            ("*where == 3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc56,"void key_iterator_suite::iterate_array()",tVar2);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::key
                     ((key_iterator *)local_208);
  local_380[0] = 3;
  tVar2 = trial::dynamic::operator==(pbVar3,local_380);
  boost::detail::test_impl
            ("where.key() == 3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc57,"void key_iterator_suite::iterate_array()",tVar2);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::value
                     ((key_iterator *)local_208);
  tVar2 = trial::dynamic::operator==(pbVar3,(char (*) [6])"alpha");
  boost::detail::test_impl
            ("where.value() == \"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc58,"void key_iterator_suite::iterate_array()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator++
            ((key_iterator *)local_208);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end
            (&local_3d8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator!=
                    ((key_iterator *)local_208,&local_3d8);
  boost::detail::test_impl
            ("where != data.key_end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc5a,"void key_iterator_suite::iterate_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_3d8);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator*
                     ((key_iterator *)local_208);
  local_3e0[1] = 4;
  tVar2 = trial::dynamic::operator==(pbVar3,local_3e0 + 1);
  boost::detail::test_impl
            ("*where == 4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc5b,"void key_iterator_suite::iterate_array()",tVar2);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::key
                     ((key_iterator *)local_208);
  local_3e0[0] = 4;
  tVar2 = trial::dynamic::operator==(pbVar3,local_3e0);
  boost::detail::test_impl
            ("where.key() == 4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc5c,"void key_iterator_suite::iterate_array()",tVar2);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::value
                     ((key_iterator *)local_208);
  tVar2 = trial::dynamic::operator==(pbVar3,(wchar_t (*) [6])L"bravo");
  boost::detail::test_impl
            ("where.value() == L\"bravo\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc5d,"void key_iterator_suite::iterate_array()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator++
            ((key_iterator *)local_208);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end
            (&local_438,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator!=
                    ((key_iterator *)local_208,&local_438);
  boost::detail::test_impl
            ("where != data.key_end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc5f,"void key_iterator_suite::iterate_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_438);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator*
                     ((key_iterator *)local_208);
  local_440[1] = 5;
  tVar2 = trial::dynamic::operator==(pbVar3,local_440 + 1);
  boost::detail::test_impl
            ("*where == 5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc60,"void key_iterator_suite::iterate_array()",tVar2);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::key
                     ((key_iterator *)local_208);
  local_440[0] = 5;
  tVar2 = trial::dynamic::operator==(pbVar3,local_440);
  boost::detail::test_impl
            ("where.key() == 5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc61,"void key_iterator_suite::iterate_array()",tVar2);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::value
                     ((key_iterator *)local_208);
  tVar2 = trial::dynamic::operator==(pbVar3,(char16_t (*) [8])L"charlie");
  boost::detail::test_impl
            ("where.value() == u\"charlie\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc62,"void key_iterator_suite::iterate_array()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator++
            ((key_iterator *)local_208);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end
            (&local_498,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator!=
                    ((key_iterator *)local_208,&local_498);
  boost::detail::test_impl
            ("where != data.key_end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc64,"void key_iterator_suite::iterate_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_498);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator*
                     ((key_iterator *)local_208);
  local_4a0[1] = 6;
  tVar2 = trial::dynamic::operator==(pbVar3,local_4a0 + 1);
  boost::detail::test_impl
            ("*where == 6",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc65,"void key_iterator_suite::iterate_array()",tVar2);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::key
                     ((key_iterator *)local_208);
  local_4a0[0] = 6;
  tVar2 = trial::dynamic::operator==(pbVar3,local_4a0);
  boost::detail::test_impl
            ("where.key() == 6",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc66,"void key_iterator_suite::iterate_array()",tVar2);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::value
                     ((key_iterator *)local_208);
  tVar2 = trial::dynamic::operator==(pbVar3,(char32_t (*) [6])L"delta");
  boost::detail::test_impl
            ("where.value() == U\"delta\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc67,"void key_iterator_suite::iterate_array()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator++
            ((key_iterator *)local_208);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end
            (&local_4f8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator==
                    ((key_iterator *)local_208,&local_4f8);
  boost::detail::test_impl
            ("where == data.key_end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc69,"void key_iterator_suite::iterate_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_4f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator
            ((key_iterator *)local_208);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void iterate_array()
{
    variable data = array::make({ true, 2, 3.0, "alpha", L"bravo", u"charlie", U"delta" });
    auto where = data.key_begin();
    TRIAL_PROTOCOL_TEST(where != data.key_end());
    TRIAL_PROTOCOL_TEST(*where == 0);
    TRIAL_PROTOCOL_TEST(where.key() == 0);
    TRIAL_PROTOCOL_TEST(where.value() == true);
    ++where;
    TRIAL_PROTOCOL_TEST(where != data.key_end());
    TRIAL_PROTOCOL_TEST(*where == 1);
    TRIAL_PROTOCOL_TEST(where.key() == 1);
    TRIAL_PROTOCOL_TEST(where.value() == 2);
    ++where;
    TRIAL_PROTOCOL_TEST(where != data.key_end());
    TRIAL_PROTOCOL_TEST(*where == 2);
    TRIAL_PROTOCOL_TEST(where.key() == 2);
    TRIAL_PROTOCOL_TEST(where.value() == 3.0);
    ++where;
    TRIAL_PROTOCOL_TEST(where != data.key_end());
    TRIAL_PROTOCOL_TEST(*where == 3);
    TRIAL_PROTOCOL_TEST(where.key() == 3);
    TRIAL_PROTOCOL_TEST(where.value() == "alpha");
    ++where;
    TRIAL_PROTOCOL_TEST(where != data.key_end());
    TRIAL_PROTOCOL_TEST(*where == 4);
    TRIAL_PROTOCOL_TEST(where.key() == 4);
    TRIAL_PROTOCOL_TEST(where.value() == L"bravo");
    ++where;
    TRIAL_PROTOCOL_TEST(where != data.key_end());
    TRIAL_PROTOCOL_TEST(*where == 5);
    TRIAL_PROTOCOL_TEST(where.key() == 5);
    TRIAL_PROTOCOL_TEST(where.value() == u"charlie");
    ++where;
    TRIAL_PROTOCOL_TEST(where != data.key_end());
    TRIAL_PROTOCOL_TEST(*where == 6);
    TRIAL_PROTOCOL_TEST(where.key() == 6);
    TRIAL_PROTOCOL_TEST(where.value() == U"delta");
    ++where;
    TRIAL_PROTOCOL_TEST(where == data.key_end());
}